

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadSubsectors<mapsubsector4_t,mapseg4_t>(MapData *map)

{
  uint uVar1;
  FileReader *pFVar2;
  int iVar3;
  subsector_t *psVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  mapsubsector4_t subd;
  
  pFVar2 = map->MapLumps[5].Reader;
  uVar8 = 0;
  uVar6 = 0;
  if (pFVar2 != (FileReader *)0x0) {
    uVar6 = (uint)pFVar2->Length;
  }
  pFVar2 = map->MapLumps[6].Reader;
  if (pFVar2 != (FileReader *)0x0) {
    uVar8 = (ulong)(uint)pFVar2->Length;
  }
  numsubsectors = (int)(uVar8 / 6);
  if ((uVar6 < 0x10) || ((uint)uVar8 < 6)) {
    Printf("This map has an incomplete BSP tree.\n",6,uVar8 % 6);
LAB_004d5332:
    if (nodes != (node_t *)0x0) {
      operator_delete__(nodes);
    }
    ForceNodeBuild = true;
  }
  else {
    uVar6 = uVar6 >> 4;
    subsectors = (subsector_t *)operator_new__((uVar8 / 6) * 0x60);
    map->file = pFVar2;
    (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar2,0,0);
    memset(subsectors,0,(long)numsubsectors * 0x60);
    lVar7 = 0x28;
    for (uVar8 = 0; (long)uVar8 < (long)numsubsectors; uVar8 = uVar8 + 1) {
      pFVar2 = map->file;
      (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,&subd,2);
      (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,&subd.firstseg,4);
      psVar4 = subsectors;
      if (subd.numsegs == 0) {
        Printf("Subsector %i is empty.\n",uVar8 & 0xffffffff);
        if (subsectors != (subsector_t *)0x0) {
          operator_delete__(subsectors);
        }
        goto LAB_004d5332;
      }
      *(uint *)((long)&((subsector_t *)(subsectors->portalcoverage + -4))->sector + lVar7) =
           (uint)subd.numsegs;
      *(ulong *)((long)(psVar4->portalcoverage + -5) + lVar7) = (ulong)subd.firstseg;
      uVar5 = *(ulong *)((long)(subsectors->portalcoverage + -5) + lVar7);
      iVar3 = (int)uVar5;
      if (uVar6 <= uVar5) {
        uVar1 = *(uint *)((long)&((subsector_t *)(subsectors->portalcoverage + -4))->sector + lVar7)
        ;
LAB_004d53a5:
        Printf("Subsector %d contains invalid segs %u-%u\nThe BSP will be rebuilt.\n",
               uVar8 & 0xffffffff,uVar5,(ulong)((iVar3 + uVar1) - 1));
        ForceNodeBuild = true;
        if (nodes != (node_t *)0x0) {
          operator_delete__(nodes);
        }
        if (subsectors == (subsector_t *)0x0) {
          return;
        }
        operator_delete__(subsectors);
        return;
      }
      uVar1 = *(uint *)((long)&((subsector_t *)(subsectors->portalcoverage + -4))->sector + lVar7);
      if ((ulong)uVar6 < uVar1 + uVar5) {
        uVar5 = (ulong)uVar6;
        goto LAB_004d53a5;
      }
      lVar7 = lVar7 + 0x60;
    }
  }
  return;
}

Assistant:

void P_LoadSubsectors (MapData * map)
{
	int i;
	DWORD maxseg = map->Size(ML_SEGS) / sizeof(segtype);

	numsubsectors = map->Size(ML_SSECTORS) / sizeof(subsectortype);

	if (numsubsectors == 0 || maxseg == 0 )
	{
		Printf ("This map has an incomplete BSP tree.\n");
		delete[] nodes;
		ForceNodeBuild = true;
		return;
	}

	subsectors = new subsector_t[numsubsectors];		
	map->Seek(ML_SSECTORS);
		
	memset (subsectors, 0, numsubsectors*sizeof(subsector_t));
	
	for (i = 0; i < numsubsectors; i++)
	{
		subsectortype subd;

		(*map->file) >> subd.numsegs >> subd.firstseg;

		if (subd.numsegs == 0)
		{
			Printf ("Subsector %i is empty.\n", i);
			delete[] subsectors;
			delete[] nodes;
			ForceNodeBuild = true;
			return;
		}

		subsectors[i].numlines = subd.numsegs;
		subsectors[i].firstline = (seg_t *)(size_t)subd.firstseg;

		if ((size_t)subsectors[i].firstline >= maxseg)
		{
			Printf ("Subsector %d contains invalid segs %u-%u\n"
				"The BSP will be rebuilt.\n", i, (unsigned)((size_t)subsectors[i].firstline),
				(unsigned)((size_t)subsectors[i].firstline) + subsectors[i].numlines - 1);
			ForceNodeBuild = true;
			delete[] nodes;
			delete[] subsectors;
			break;
		}
		else if ((size_t)subsectors[i].firstline + subsectors[i].numlines > maxseg)
		{
			Printf ("Subsector %d contains invalid segs %u-%u\n"
				"The BSP will be rebuilt.\n", i, maxseg,
				(unsigned)((size_t)subsectors[i].firstline) + subsectors[i].numlines - 1);
			ForceNodeBuild = true;
			delete[] nodes;
			delete[] subsectors;
			break;
		}
	}
}